

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnTable
          (BinaryReaderObjdump *this,Index index,Type elem_type,Limits *elem_limits)

{
  char *pcVar1;
  string_view sVar2;
  Type local_1c;
  
  local_1c.enum_ = elem_type.enum_;
  pcVar1 = Type::GetName(&local_1c);
  PrintDetails(this," - table[%u] type=%s initial=%ld",index,pcVar1,elem_limits->initial);
  if (elem_limits->has_max == true) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  sVar2 = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,index);
  if (sVar2.size_ != 0) {
    PrintDetails(this," <%.*s>",sVar2.size_,sVar2.data_);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, index,
               elem_type.GetName(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  auto name = GetTableName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}